

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O1

void __thiscall n_e_s::nes::Nes::Nes(Nes *this)

{
  PpuRegisters *registers;
  CpuRegisters *pCVar1;
  pointer *__ptr_4;
  pointer *__ptr;
  pointer *__ptr_1;
  pointer *__ptr_3;
  pointer *__ptr_2;
  
  core::MmuFactory::create_empty();
  registers = (PpuRegisters *)operator_new(0x1e);
  registers->write_toggle = false;
  registers->odd_frame = false;
  registers->name_table_latch = '\0';
  registers->name_table = '\0';
  registers->pattern_table_latch_low = '\0';
  registers->pattern_table_latch_hi = '\0';
  registers->pattern_table_shifter_low = 0;
  registers->pattern_table_shifter_hi = 0;
  registers->attribute_table_latch = '\0';
  registers->field_0x19 = 0;
  registers->attribute_table_shifter_low = 0;
  registers->attribute_table_shifter_hi = 0;
  registers->scanline = 0;
  registers->cycle = 0;
  registers->ctrl = '\0';
  registers->mask = (Register<unsigned_char>)0x0;
  registers->status = '\0';
  registers->oamaddr = '\0';
  registers->fine_x_scroll = '\0';
  registers->field_0x9 = 0;
  registers->vram_addr = (Register<unsigned_short>)0x0;
  registers->temp_vram_addr = (Register<unsigned_short>)0x0;
  registers->write_toggle = false;
  registers->odd_frame = false;
  (this->ppu_registers_)._M_t.
  super___uniq_ptr_impl<n_e_s::core::PpuRegisters,_std::default_delete<n_e_s::core::PpuRegisters>_>.
  _M_t.
  super__Tuple_impl<0UL,_n_e_s::core::PpuRegisters_*,_std::default_delete<n_e_s::core::PpuRegisters>_>
  .super__Head_base<0UL,_n_e_s::core::PpuRegisters_*,_false>._M_head_impl = registers;
  core::PpuFactory::create
            ((PpuFactory *)&this->ppu_,registers,
             (this->ppu_mmu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl);
  core::MmuFactory::create_empty();
  pCVar1 = (CpuRegisters *)operator_new(8);
  pCVar1->pc = 0;
  pCVar1->sp = '\0';
  pCVar1->a = '\0';
  pCVar1->x = '\0';
  pCVar1->y = '\0';
  pCVar1->p = '\0';
  pCVar1->field_0x7 = 0;
  (this->cpu_registers_)._M_t.
  super___uniq_ptr_impl<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>.
  _M_t.
  super__Tuple_impl<0UL,_n_e_s::core::CpuRegisters_*,_std::default_delete<n_e_s::core::CpuRegisters>_>
  .super__Head_base<0UL,_n_e_s::core::CpuRegisters_*,_false>._M_head_impl = pCVar1;
  core::CpuFactory::create_mos6502
            ((CpuFactory *)&this->cpu_,pCVar1,
             (this->mmu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl,
             (this->ppu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
             super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl);
  (this->rom_)._M_t.
  super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
  super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl = (IRom *)0x0;
  core::NesControllerFactory::create_nes_controller();
  core::NesControllerFactory::create_nes_controller();
  this->cycle_ = 0;
  pCVar1 = (this->cpu_registers_)._M_t.
           super___uniq_ptr_impl<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::CpuRegisters_*,_std::default_delete<n_e_s::core::CpuRegisters>_>
           .super__Head_base<0UL,_n_e_s::core::CpuRegisters_*,_false>._M_head_impl;
  pCVar1->p = '$';
  pCVar1->sp = 0xfd;
  pCVar1->a = '\0';
  pCVar1->x = '\0';
  pCVar1->y = '\0';
  return;
}

Assistant:

Nes::Nes()
        : ppu_mmu_(MmuFactory::create_empty()),
          ppu_registers_(std::make_unique<n_e_s::core::PpuRegisters>()),
          ppu_(PpuFactory::create(ppu_registers_.get(), ppu_mmu_.get())),
          mmu_(MmuFactory::create_empty()),
          cpu_registers_(std::make_unique<n_e_s::core::CpuRegisters>()),
          cpu_(CpuFactory::create_mos6502(cpu_registers_.get(),
                  mmu_.get(),
                  ppu_.get())),
          controller1_(NesControllerFactory::create_nes_controller()),
          controller2_(NesControllerFactory::create_nes_controller()) {
    // P should be set to 0x34 according to the information here:
    // https://wiki.nesdev.com/w/index.php/CPU_power_up_state
    // However, nestest sets p to 0x24 instead. We do that for now as well.
    cpu_registers_->p = I_FLAG | FLAG_5;
    cpu_registers_->a = cpu_registers_->x = cpu_registers_->y = 0x00;
    cpu_registers_->sp = 0xFD;
}